

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode.c
# Opt level: O0

int ARKodeResize(void *arkode_mem,N_Vector y0,sunrealtype hscale,sunrealtype t0,
                ARKVecResizeFn resize,void *resize_data)

{
  int iVar1;
  ARKVecResizeFn resize_00;
  void *resize_data_00;
  void *in_RCX;
  N_Vector in_RDX;
  N_Vector in_RSI;
  ARKodeMem in_RDI;
  double in_XMM0_Qa;
  sunrealtype in_XMM1_Qa;
  ARKodeMem ark_mem;
  int retval;
  sunindextype liw_diff;
  sunindextype lrw_diff;
  sunindextype liw1;
  sunindextype lrw1;
  int resizeOK;
  N_Vector p_Var2;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  ARKInterp interp;
  ARKodeMem_conflict ark_mem_00;
  double local_20;
  uint local_4;
  
  if (in_RDI == (ARKodeMem)0x0) {
    arkProcessError((ARKodeMem)0x0,-0x15,0x5a,"ARKodeResize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode.c"
                    ,"arkode_mem = NULL illegal.");
    local_4 = 0xffffffeb;
  }
  else if (in_RDI->MallocDone == 0) {
    arkProcessError(in_RDI,-0x17,99,"ARKodeResize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode.c"
                    ,"Attempt to call before ARKodeInit.");
    local_4 = 0xffffffe9;
  }
  else if (in_RSI == (N_Vector)0x0) {
    arkProcessError(in_RDI,-0x16,0x6b,"ARKodeResize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode.c"
                    ,"y0 = NULL illegal.");
    local_4 = 0xffffffea;
  }
  else {
    in_RDI->tcur = in_XMM1_Qa;
    in_RDI->tn = in_XMM1_Qa;
    local_20 = in_XMM0_Qa;
    if (in_XMM0_Qa < 0.0) {
      local_20 = 1.0;
    }
    if ((local_20 != 1.0) || (NAN(local_20))) {
      in_RDI->eta = local_20;
      in_RDI->hprime = local_20 * in_RDI->hprime;
      if ((in_RDI->tstopset != 0) &&
         (0.0 < ((in_RDI->tcur + in_RDI->hprime) - in_RDI->tstop) * in_RDI->hprime)) {
        in_RDI->hprime = (in_RDI->tstop - in_RDI->tcur) * (in_RDI->uround * -4.0 + 1.0);
        in_RDI->eta = in_RDI->hprime / in_RDI->h;
      }
    }
    interp = (ARKInterp)0x0;
    ark_mem_00 = (ARKodeMem)0x0;
    if (in_RSI->ops->nvspace != (_func_void_N_Vector_sunindextype_ptr_sunindextype_ptr *)0x0) {
      N_VSpace(in_RSI,&stack0xffffffffffffffb8,&stack0xffffffffffffffb0);
    }
    resize_00 = (ARKVecResizeFn)((long)ark_mem_00 - in_RDI->lrw1);
    resize_data_00 = (void *)((long)interp - in_RDI->liw1);
    in_RDI->lrw1 = (sunindextype)ark_mem_00;
    in_RDI->liw1 = (sunindextype)interp;
    iVar1 = arkResizeVectors(ark_mem_00,(ARKVecResizeFn)interp,resize_00,
                             (sunindextype)resize_data_00,
                             CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                             (N_Vector)in_RDI);
    if (iVar1 == 0) {
      arkProcessError(in_RDI,-0x14,0x97,"ARKodeResize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode.c"
                      ,"Unable to resize vector");
      local_4 = 0xffffffec;
    }
    else if ((in_RDI->interp == (ARKInterp)0x0) ||
            (p_Var2 = in_RSI,
            local_4 = arkInterpResize(ark_mem_00,interp,resize_00,resize_data_00,
                                      CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                                      (sunindextype)in_RDI,in_RDX), local_4 == 0)) {
      N_VScale(0x3ff0000000000000,in_RSI,in_RDI->yn);
      in_RDI->fn_is_current = 0;
      in_RDI->constraintsSet = 0;
      in_RDI->initsetup = 1;
      in_RDI->init_type = 2;
      in_RDI->firststage = 1;
      if (in_RDI->step_resize == (ARKTimestepResize)0x0) {
        local_4 = 0;
      }
      else {
        local_4 = (*in_RDI->step_resize)
                            (in_RDI,in_RSI,local_20,in_XMM1_Qa,(ARKVecResizeFn)in_RDX,in_RCX);
      }
    }
    else {
      arkProcessError(in_RDI,(int)(ulong)local_4,0xa3,"ARKodeResize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode.c"
                      ,"Interpolation module resize failure",p_Var2);
    }
  }
  return local_4;
}

Assistant:

int ARKodeResize(void* arkode_mem, N_Vector y0, sunrealtype hscale,
                 sunrealtype t0, ARKVecResizeFn resize, void* resize_data)
{
  sunbooleantype resizeOK;
  sunindextype lrw1, liw1, lrw_diff, liw_diff;
  int retval;
  ARKodeMem ark_mem;

  /* Check ark_mem */
  if (arkode_mem == NULL)
  {
    arkProcessError(NULL, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_ARK_NO_MEM);
    return (ARK_MEM_NULL);
  }
  ark_mem = (ARKodeMem)arkode_mem;

  /* Check if ark_mem was allocated */
  if (ark_mem->MallocDone == SUNFALSE)
  {
    arkProcessError(ark_mem, ARK_NO_MALLOC, __LINE__, __func__, __FILE__,
                    MSG_ARK_NO_MALLOC);
    return (ARK_NO_MALLOC);
  }

  /* Check for legal input parameters */
  if (y0 == NULL)
  {
    arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_ARK_NULL_Y0);
    return (ARK_ILL_INPUT);
  }

  /* Copy the input parameters into ARKODE state */
  ark_mem->tcur = t0;
  ark_mem->tn   = t0;

  /* Update time-stepping parameters */
  /*   adjust upcoming step size depending on hscale */
  if (hscale < ZERO) { hscale = ONE; }
  if (hscale != ONE)
  {
    /* Encode hscale into ark_mem structure */
    ark_mem->eta = hscale;
    ark_mem->hprime *= hscale;

    /* If next step would overtake tstop, adjust stepsize */
    if (ark_mem->tstopset)
    {
      if ((ark_mem->tcur + ark_mem->hprime - ark_mem->tstop) * ark_mem->hprime >
          ZERO)
      {
        ark_mem->hprime = (ark_mem->tstop - ark_mem->tcur) *
                          (ONE - FOUR * ark_mem->uround);
        ark_mem->eta = ark_mem->hprime / ark_mem->h;
      }
    }
  }

  /* Determing change in vector sizes */
  lrw1 = liw1 = 0;
  if (y0->ops->nvspace != NULL) { N_VSpace(y0, &lrw1, &liw1); }
  lrw_diff      = lrw1 - ark_mem->lrw1;
  liw_diff      = liw1 - ark_mem->liw1;
  ark_mem->lrw1 = lrw1;
  ark_mem->liw1 = liw1;

  /* Resize the solver vectors (using y0 as a template) */
  resizeOK = arkResizeVectors(ark_mem, resize, resize_data, lrw_diff, liw_diff,
                              y0);
  if (!resizeOK)
  {
    arkProcessError(ark_mem, ARK_MEM_FAIL, __LINE__, __func__, __FILE__,
                    "Unable to resize vector");
    return (ARK_MEM_FAIL);
  }

  /* Resize the interpolation structure memory */
  if (ark_mem->interp != NULL)
  {
    retval = arkInterpResize(ark_mem, ark_mem->interp, resize, resize_data,
                             lrw_diff, liw_diff, y0);
    if (retval != ARK_SUCCESS)
    {
      arkProcessError(ark_mem, retval, __LINE__, __func__, __FILE__,
                      "Interpolation module resize failure");
      return (retval);
    }
  }

  /* Copy y0 into ark_yn to set the current solution */
  N_VScale(ONE, y0, ark_mem->yn);
  ark_mem->fn_is_current = SUNFALSE;

  /* Disable constraints */
  ark_mem->constraintsSet = SUNFALSE;

  /* Indicate that problem needs to be initialized */
  ark_mem->initsetup  = SUNTRUE;
  ark_mem->init_type  = RESIZE_INIT;
  ark_mem->firststage = SUNTRUE;

  /* Call the stepper-specific resize (if provided) */
  if (ark_mem->step_resize)
  {
    return (ark_mem->step_resize(ark_mem, y0, hscale, t0, resize, resize_data));
  }

  /* Problem has been successfully re-sized */
  return (ARK_SUCCESS);
}